

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O2

Expression *
slang::ast::AssignmentExpression::fromSyntax
          (Compilation *compilation,BinaryExpressionSyntax *syntax,ASTContext *context)

{
  not_null<slang::syntax::ExpressionSyntax_*> *this;
  SyntaxKind kind;
  bool bVar1;
  uint uVar2;
  BinaryOperator BVar3;
  ulong uVar4;
  Expression *pEVar5;
  SyntaxNode *this_00;
  TimingControlExpressionSyntax *pTVar6;
  TimingControlSyntax *pTVar7;
  SourceLocation assignLoc;
  ExpressionSyntax *pEVar8;
  SyntaxNode *this_01;
  AssignmentPatternExpressionSyntax *pAVar9;
  Type *pTVar10;
  Expression *this_02;
  SourceLocation rhs;
  bitmask<slang::ast::AssignFlags> flags;
  ulong uVar11;
  socklen_t __len;
  optional<slang::ast::BinaryOperator> op;
  DiagCode code;
  not_null<const_slang::ast::Type_*> *this_03;
  SourceRange SVar12;
  bitmask<slang::ast::ASTFlags> extraFlags;
  SourceLocation local_88;
  SourceLocation SStack_80;
  SourceLocation local_78;
  SourceLocation SStack_70;
  Expression *lhs;
  char acStack_60 [8];
  ulong local_58;
  Symbol *pSStack_50;
  TempVarSymbol *local_48;
  RandomizeDetails *pRStack_40;
  AssertionInstanceDetails *local_38;
  undefined4 extraout_var;
  
  kind = (syntax->super_ExpressionSyntax).super_SyntaxNode.kind;
  uVar2 = 0;
  uVar11 = (context->flags).m_bits;
  if (kind == NonblockingAssignmentExpression) {
    if (((uint)uVar11 >> 0xe & 1) != 0) {
      SVar12 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      code.subsystem = Expressions;
      code.code = 0x9c;
      goto LAB_0030746d;
    }
    uVar2 = 1;
  }
  if ((uVar11 & 0x20) == 0) {
    SVar12 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    code.subsystem = Expressions;
    code.code = 0xb;
    if ((uVar11 & 0xc0) == 0) {
      code.subsystem = Expressions;
      code.code = 0x16;
    }
LAB_0030746d:
    ASTContext::addDiag(context,code,SVar12);
    pEVar5 = Expression::badExpr(compilation,(Expression *)0x0);
    return pEVar5;
  }
  extraFlags.m_bits = 0x200;
  uVar11 = 0;
  if (kind == AssignmentExpression) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    if (kind != NonblockingAssignmentExpression) {
      BVar3 = Expression::getBinaryOperator(kind);
      uVar11 = (ulong)BVar3;
      uVar4 = 0x100000000;
      extraFlags.m_bits = 0;
    }
  }
  this_00 = &not_null<slang::syntax::ExpressionSyntax_*>::get(&syntax->right)->super_SyntaxNode;
  if ((((context->flags).m_bits & 0x400) == 0) || (this_00->kind != TimingControlExpression)) {
    assignLoc = (SourceLocation)0x0;
  }
  else {
    lhs = (Expression *)(context->scope).ptr;
    acStack_60 = *(char (*) [8])&context->lookupIndex;
    pSStack_50 = context->instanceOrProc;
    local_48 = context->firstTempVar;
    pRStack_40 = context->randomizeDetails;
    local_38 = context->assertionInstance;
    local_58 = (ulong)(kind == NonblockingAssignmentExpression) << 0xf | (context->flags).m_bits |
               0x400000;
    pTVar6 = slang::syntax::SyntaxNode::as<slang::syntax::TimingControlExpressionSyntax>(this_00);
    pTVar7 = not_null<slang::syntax::TimingControlSyntax_*>::get(&pTVar6->timing);
    assignLoc._0_4_ = TimingControl::bind((int)pTVar7,(sockaddr *)&lhs,__len);
    assignLoc._4_4_ = extraout_var;
    this_00 = &not_null<slang::syntax::ExpressionSyntax_*>::get(&pTVar6->expr)->super_SyntaxNode;
  }
  this = &syntax->left;
  pEVar8 = not_null<slang::syntax::ExpressionSyntax_*>::get(this);
  if (((pEVar8->super_SyntaxNode).kind == AssignmentPatternExpression) &&
     (this_00->kind != StreamingConcatenationExpression)) {
    this_01 = &not_null<slang::syntax::ExpressionSyntax_*>::get(this)->super_SyntaxNode;
    pAVar9 = slang::syntax::SyntaxNode::as<slang::syntax::AssignmentPatternExpressionSyntax>
                       (this_01);
    if (pAVar9->type == (DataTypeSyntax *)0x0) {
      this_02 = Expression::selfDetermined
                          (compilation,(ExpressionSyntax *)this_00,context,
                           (bitmask<slang::ast::ASTFlags>)0x0);
      bVar1 = Expression::bad(this_02);
      if (bVar1) {
        pEVar5 = Expression::badExpr(compilation,this_02);
        return pEVar5;
      }
      pEVar8 = not_null<slang::syntax::ExpressionSyntax_*>::get(this);
      pTVar10 = not_null<const_slang::ast::Type_*>::get(&this_02->type);
      lhs = Expression::create(compilation,pEVar8,context,(bitmask<slang::ast::ASTFlags>)0x400000,
                               pTVar10);
      Expression::selfDetermined(context,&lhs);
      extraFlags.m_bits = (underlying_type)lhs;
      rhs = parsing::Token::location(&syntax->operatorToken);
      SVar12 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      local_78 = SVar12.startLoc;
      SStack_70 = SVar12.endLoc;
      flags.m_bits = (underlying_type)extraFlags.m_bits;
      local_88 = local_78;
      SStack_80 = SStack_70;
      goto LAB_00307677;
    }
  }
  pEVar8 = not_null<slang::syntax::ExpressionSyntax_*>::get(this);
  pEVar5 = Expression::selfDetermined
                     (compilation,pEVar8,context,
                      (bitmask<slang::ast::ASTFlags>)
                      &((ASTContext *)(extraFlags.m_bits + 0x3ffff0))->flags);
  this_03 = &pEVar5->type;
  pTVar10 = not_null<const_slang::ast::Type_*>::get(this_03);
  bVar1 = Type::isVirtualInterface(pTVar10);
  if (bVar1) {
    pTVar10 = not_null<const_slang::ast::Type_*>::get(this_03);
    this_02 = Expression::tryBindInterfaceRef(context,(ExpressionSyntax *)this_00,pTVar10);
    if (this_02 == (Expression *)0x0) goto LAB_003075d8;
  }
  else {
LAB_003075d8:
    if ((pEVar5->kind == Streaming) && (this_00->kind != StreamingConcatenationExpression)) {
      this_02 = Expression::selfDetermined
                          (compilation,(ExpressionSyntax *)this_00,context,extraFlags);
    }
    else {
      pTVar10 = not_null<const_slang::ast::Type_*>::get(this_03);
      this_02 = Expression::create(compilation,(ExpressionSyntax *)this_00,context,extraFlags,
                                   pTVar10);
    }
  }
  rhs = parsing::Token::location(&syntax->operatorToken);
  SVar12 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  local_88 = SVar12.startLoc;
  SStack_80 = SVar12.endLoc;
  flags.m_bits = (underlying_type)pEVar5;
LAB_00307677:
  op.super__Optional_base<slang::ast::BinaryOperator,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::BinaryOperator>._4_4_ = 0;
  op.super__Optional_base<slang::ast::BinaryOperator,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::BinaryOperator>._M_payload._M_value = uVar2;
  SVar12.endLoc = (SourceLocation)context;
  SVar12.startLoc = SStack_80;
  pEVar5 = fromComponents((AssignmentExpression *)compilation,(Compilation *)(uVar4 | uVar11),op,
                          flags,this_02,(Expression *)rhs,assignLoc,(TimingControl *)local_88,SVar12
                          ,(ASTContext *)extraFlags.m_bits);
  return pEVar5;
}

Assistant:

Expression& AssignmentExpression::fromSyntax(Compilation& compilation,
                                             const BinaryExpressionSyntax& syntax,
                                             const ASTContext& context) {
    bitmask<AssignFlags> assignFlags;
    bool isNonBlocking = syntax.kind == SyntaxKind::NonblockingAssignmentExpression;
    if (isNonBlocking)
        assignFlags = AssignFlags::NonBlocking;

    if (isNonBlocking && context.flags.has(ASTFlags::Final)) {
        context.addDiag(diag::NonblockingInFinal, syntax.sourceRange());
        return badExpr(compilation, nullptr);
    }

    if (!context.flags.has(ASTFlags::AssignmentAllowed)) {
        if (!context.flags.has(ASTFlags::NonProcedural) &&
            !context.flags.has(ASTFlags::AssignmentDisallowed)) {
            context.addDiag(diag::AssignmentRequiresParens, syntax.sourceRange());
        }
        else {
            context.addDiag(diag::AssignmentNotAllowed, syntax.sourceRange());
        }
        return badExpr(compilation, nullptr);
    }

    bitmask<ASTFlags> extraFlags = ASTFlags::None;
    std::optional<BinaryOperator> op;
    if (syntax.kind != SyntaxKind::AssignmentExpression &&
        syntax.kind != SyntaxKind::NonblockingAssignmentExpression) {
        op = getBinaryOperator(syntax.kind);
    }
    else {
        extraFlags |= ASTFlags::StreamingAllowed;
    }

    const ExpressionSyntax* rightExpr = syntax.right;

    // If we're in a top-level statement, check for an intra-assignment timing control.
    // Otherwise, we'll let this fall through to the default handler which will issue an error.
    const TimingControl* timingControl = nullptr;
    if (context.flags.has(ASTFlags::TopLevelStatement) &&
        rightExpr->kind == SyntaxKind::TimingControlExpression) {

        ASTContext timingCtx = context;
        timingCtx.flags |= ASTFlags::LValue;
        if (isNonBlocking)
            timingCtx.flags |= ASTFlags::NonBlockingTimingControl;

        auto& tce = rightExpr->as<TimingControlExpressionSyntax>();
        timingControl = &TimingControl::bind(*tce.timing, timingCtx);
        rightExpr = tce.expr;
    }

    // The right hand side of an assignment expression is typically an
    // "assignment-like context", except if the left hand side does not
    // have a self-determined type. That can only be true if the lhs is
    // an assignment pattern without an explicit type.
    // However, streaming concatenation has no explicit type either so it is excluded and such right
    // hand side will lead to diag::AssignmentPatternNoContext error later.
    if (syntax.left->kind == SyntaxKind::AssignmentPatternExpression &&
        rightExpr->kind != SyntaxKind::StreamingConcatenationExpression) {
        auto& pattern = syntax.left->as<AssignmentPatternExpressionSyntax>();
        if (!pattern.type) {
            // In this case we have to bind the rhs first to determine the
            // correct type to use as the context for the lhs.
            Expression* rhs = &selfDetermined(compilation, *rightExpr, context);
            if (rhs->bad())
                return badExpr(compilation, rhs);

            auto lhs = &create(compilation, *syntax.left, context, ASTFlags::LValue, rhs->type);
            selfDetermined(context, lhs);

            return fromComponents(compilation, op, assignFlags, *lhs, *rhs,
                                  syntax.operatorToken.location(), timingControl,
                                  syntax.sourceRange(), context);
        }
    }

    auto& lhs = selfDetermined(compilation, *syntax.left, context, extraFlags | ASTFlags::LValue);

    Expression* rhs = nullptr;
    if (lhs.type->isVirtualInterface())
        rhs = tryBindInterfaceRef(context, *rightExpr, *lhs.type);

    if (!rhs) {
        // When LHS is a streaming concatenation which has no explicit type, RHS should be
        // self-determined and we cannot pass lsh.type to it. When both LHS and RHS are streaming
        // concatenations, pass lhs.type to notify RHS to exclude associative arrays for
        // isBitstreamType check, while RHS can still be self-determined by ignoring lhs type
        // information.
        if (lhs.kind == ExpressionKind::Streaming &&
            rightExpr->kind != SyntaxKind::StreamingConcatenationExpression) {
            rhs = &selfDetermined(compilation, *rightExpr, context, extraFlags);
        }
        else {
            rhs = &create(compilation, *rightExpr, context, extraFlags, lhs.type);
        }
    }

    return fromComponents(compilation, op, assignFlags, lhs, *rhs, syntax.operatorToken.location(),
                          timingControl, syntax.sourceRange(), context);
}